

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall argparse::Argument::validate(Argument *this)

{
  byte bVar1;
  pointer paVar2;
  pointer paVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  long lVar6;
  string local_1c0 [32];
  stringstream stream;
  ostream local_190 [376];
  
  lVar6 = (long)this->mNumArgs;
  if (-1 < lVar6) {
    bVar1 = this->field_0xbc;
    if ((bVar1 & 1) == 0) {
      if (((long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4 != lVar6) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar4 = std::operator<<(local_190,(string *)&this->mUsedName);
        poVar4 = std::operator<<(poVar4,": expected ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," argument(s). ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4," provided.");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,local_1c0);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if ((bVar1 & 4) == 0) {
      if (((bVar1 & 2) != 0) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar4 = std::operator<<(local_190,
                                 (string *)
                                 (this->mNames).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        std::operator<<(poVar4,": required.");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,local_1c0);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      paVar2 = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish;
      paVar3 = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((long)paVar2 - (long)paVar3 >> 4 != lVar6) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar4 = std::operator<<(local_190,(string *)&this->mUsedName);
        poVar4 = std::operator<<(poVar4,": expected ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," argument(s). ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4," provided.");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,local_1c0);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (paVar2 == paVar3 && (~bVar1 & 6) == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar4 = std::operator<<(local_190,(string *)&this->mUsedName);
        std::operator<<(poVar4,": no value provided.");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,local_1c0);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

auto maybe_nargs() const -> std::optional<size_t> {
    if (mNumArgs < 0)
      return std::nullopt;
    else
      return static_cast<size_t>(mNumArgs);
  }